

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
s2textformat::MakeIndexOrDie(string_view str)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  char *in_RDX;
  string_view str_00;
  string_view piece;
  S2LogMessage SStack_38;
  
  absl::make_unique<MutableS2ShapeIndex>();
  str_00.length_ = (size_type)in_RDX;
  str_00.ptr_ = (char *)str.length_;
  bVar1 = MakeIndex(str_00,(unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
                            *)str.ptr_);
  if (!bVar1) {
    sVar3 = 3;
    S2LogMessage::S2LogMessage
              (&SStack_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
               ,0x134,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_38.stream_,"Check failed: MakeIndex(str, &index) ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(SStack_38.stream_,": str == \"",10);
    piece.length_ = sVar3;
    piece.ptr_ = in_RDX;
    poVar2 = absl::operator<<((absl *)SStack_38.stream_,(ostream *)str.length_,piece);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    if (!bVar1) {
      abort();
    }
  }
  return (__uniq_ptr_data<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>,_true,_true>
         )(tuple<MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>)str.ptr_;
}

Assistant:

unique_ptr<MutableS2ShapeIndex> MakeIndexOrDie(string_view str) {
  auto index = make_unique<MutableS2ShapeIndex>();
  S2_CHECK(MakeIndex(str, &index)) << ": str == \"" << str << "\"";
  return index;
}